

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O1

void __thiscall
vkt::shaderexecutor::anon_unknown_0::FragmentOutExecutor::addAttribute
          (FragmentOutExecutor *this,deUint32 bindingLocation,VkFormat format,
          deUint32 sizePerElement,deUint32 count,void *dataPtr)

{
  long *plVar1;
  long lVar2;
  pointer *ppVVar3;
  pointer *ppVVar4;
  iterator __position;
  iterator __position_00;
  Allocation *pAVar5;
  VkResult result;
  VkDevice device;
  DeviceInterface *vk;
  Allocator *pAVar6;
  deUint64 *pdVar7;
  ulong __n;
  deUint32 dVar8;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> alloc;
  VkVertexInputBindingDescription bindingDescription;
  VkVertexInputAttributeDescription attributeDescription;
  Move<vk::Handle<(vk::HandleType)8>_> buffer;
  deUint32 queueFamilyIndex;
  VkBufferCreateInfo vertexBufferParams;
  VkMemoryRequirements local_e8;
  Allocation *local_c8 [2];
  VkVertexInputBindingDescription local_b4;
  VkVertexInputAttributeDescription local_a8;
  Move<vk::Handle<(vk::HandleType)8>_> local_98;
  void *local_78;
  deUint32 local_6c;
  VkBufferCreateInfo local_68;
  
  __position._M_current =
       (this->m_vertexBindingDescriptions).
       super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  dVar8 = (int)((ulong)((long)__position._M_current -
                       (long)(this->m_vertexBindingDescriptions).
                             super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
  local_b4.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  local_b4.binding = dVar8;
  local_b4.stride = sizePerElement;
  local_78 = dataPtr;
  if (__position._M_current ==
      (this->m_vertexBindingDescriptions).
      super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vk::VkVertexInputBindingDescription,std::allocator<vk::VkVertexInputBindingDescription>>
    ::_M_realloc_insert<vk::VkVertexInputBindingDescription_const&>
              ((vector<vk::VkVertexInputBindingDescription,std::allocator<vk::VkVertexInputBindingDescription>>
                *)&this->m_vertexBindingDescriptions,__position,&local_b4);
  }
  else {
    (__position._M_current)->inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
    (__position._M_current)->binding = dVar8;
    (__position._M_current)->stride = sizePerElement;
    ppVVar3 = &(this->m_vertexBindingDescriptions).
               super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar3 = *ppVVar3 + 1;
  }
  local_a8.offset = 0;
  __position_00._M_current =
       (this->m_vertexAttributeDescriptions).
       super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_a8.location = bindingLocation;
  local_a8.binding = dVar8;
  local_a8.format = format;
  if (__position_00._M_current ==
      (this->m_vertexAttributeDescriptions).
      super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vk::VkVertexInputAttributeDescription,std::allocator<vk::VkVertexInputAttributeDescription>>
    ::_M_realloc_insert<vk::VkVertexInputAttributeDescription_const&>
              ((vector<vk::VkVertexInputAttributeDescription,std::allocator<vk::VkVertexInputAttributeDescription>>
                *)&this->m_vertexAttributeDescriptions,__position_00,&local_a8);
  }
  else {
    (__position_00._M_current)->location = bindingLocation;
    (__position_00._M_current)->binding = dVar8;
    (__position_00._M_current)->format = (int)(ulong)format;
    (__position_00._M_current)->offset = (int)((ulong)format >> 0x20);
    ppVVar4 = &(this->m_vertexAttributeDescriptions).
               super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar4 = *ppVVar4 + 1;
  }
  device = Context::getDevice((this->super_ShaderExecutor).m_context);
  vk = Context::getDeviceInterface((this->super_ShaderExecutor).m_context);
  local_6c = Context::getUniversalQueueFamilyIndex((this->super_ShaderExecutor).m_context);
  local_68.pQueueFamilyIndices = &local_6c;
  __n = (ulong)(count * sizePerElement);
  local_68.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_68.pNext = (void *)0x0;
  local_68.flags = 0;
  local_68.usage = 0x80;
  local_68.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_68.queueFamilyIndexCount = 1;
  local_68.size = __n;
  ::vk::createBuffer(&local_98,vk,device,&local_68,(VkAllocationCallbacks *)0x0);
  pAVar6 = Context::getDefaultAllocator((this->super_ShaderExecutor).m_context);
  ::vk::getBufferMemoryRequirements
            (&local_e8,vk,device,
             (VkBuffer)
             local_98.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  (*pAVar6->_vptr_Allocator[3])(local_c8,pAVar6,&local_e8,1);
  result = (*vk->_vptr_DeviceInterface[0xc])
                     (vk,device,
                      local_98.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                      m_internal,(local_c8[0]->m_memory).m_internal,local_c8[0]->m_offset);
  ::vk::checkResult(result,
                    "vk.bindBufferMemory(vkDevice, *buffer, alloc->getMemory(), alloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderexecutor/vktShaderExecutor.cpp"
                    ,0x275);
  memcpy(local_c8[0]->m_hostPtr,local_78,__n);
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)(local_c8[0]->m_memory).m_internal,local_c8[0]->m_offset,__n)
  ;
  pdVar7 = (deUint64 *)operator_new(0x20);
  pdVar7[2] = (deUint64)
              local_98.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  pdVar7[3] = (deUint64)
              local_98.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  *pdVar7 = local_98.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  pdVar7[1] = (deUint64)
              local_98.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_e8.alignment = 0;
  local_e8.size = (VkDeviceSize)pdVar7;
  local_e8.alignment = (VkDeviceSize)operator_new(0x20);
  *(undefined4 *)(local_e8.alignment + 8) = 0;
  *(undefined4 *)(local_e8.alignment + 0xc) = 0;
  *(undefined ***)local_e8.alignment = &PTR__SharedPtrState_00d1ddd0;
  *(deUint64 **)(local_e8.alignment + 0x10) = pdVar7;
  *(undefined4 *)(local_e8.alignment + 8) = 1;
  *(undefined4 *)(local_e8.alignment + 0xc) = 1;
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>>
  ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>
            ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>>
              *)&this->m_vertexBuffers,
             (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> *)&local_e8);
  if ((long *)local_e8.alignment != (long *)0x0) {
    LOCK();
    plVar1 = (long *)(local_e8.alignment + 8);
    *(int *)plVar1 = (int)*plVar1 + -1;
    UNLOCK();
    if ((int)*plVar1 == 0) {
      local_e8.size = 0;
      (**(code **)(*(long *)local_e8.alignment + 0x10))();
    }
    LOCK();
    lVar2 = local_e8.alignment + 0xc;
    *(int *)lVar2 = *(int *)lVar2 + -1;
    UNLOCK();
    if ((*(int *)lVar2 == 0) && ((long *)local_e8.alignment != (long *)0x0)) {
      (**(code **)(*(long *)local_e8.alignment + 8))();
    }
  }
  pAVar5 = local_c8[0];
  local_c8[0] = (Allocation *)0x0;
  local_e8.alignment = 0;
  local_e8.size = (VkDeviceSize)pAVar5;
  local_e8.alignment = (VkDeviceSize)operator_new(0x20);
  *(undefined4 *)(local_e8.alignment + 8) = 0;
  *(undefined4 *)(local_e8.alignment + 0xc) = 0;
  *(undefined ***)local_e8.alignment = &PTR__SharedPtrState_00d1fc38;
  *(Allocation **)(local_e8.alignment + 0x10) = pAVar5;
  *(undefined4 *)(local_e8.alignment + 8) = 1;
  *(undefined4 *)(local_e8.alignment + 0xc) = 1;
  std::vector<de::SharedPtr<vk::Allocation>,std::allocator<de::SharedPtr<vk::Allocation>>>::
  emplace_back<de::SharedPtr<vk::Allocation>>
            ((vector<de::SharedPtr<vk::Allocation>,std::allocator<de::SharedPtr<vk::Allocation>>> *)
             &this->m_vertexBufferAllocs,(SharedPtr<vk::Allocation> *)&local_e8);
  if ((long *)local_e8.alignment != (long *)0x0) {
    LOCK();
    plVar1 = (long *)(local_e8.alignment + 8);
    *(int *)plVar1 = (int)*plVar1 + -1;
    UNLOCK();
    if ((int)*plVar1 == 0) {
      local_e8.size = 0;
      (**(code **)(*(long *)local_e8.alignment + 0x10))();
    }
    LOCK();
    lVar2 = local_e8.alignment + 0xc;
    *(int *)lVar2 = *(int *)lVar2 + -1;
    UNLOCK();
    if (*(int *)lVar2 == 0) {
      if ((long *)local_e8.alignment != (long *)0x0) {
        (**(code **)(*(long *)local_e8.alignment + 8))();
      }
      local_e8.alignment = 0;
    }
  }
  if (local_c8[0] != (Allocation *)0x0) {
    (*local_c8[0]->_vptr_Allocation[1])();
    local_c8[0] = (Allocation *)0x0;
  }
  if (local_98.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_98.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_98.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  return;
}

Assistant:

void FragmentOutExecutor::addAttribute (deUint32 bindingLocation, VkFormat format, deUint32 sizePerElement, deUint32 count, const void* dataPtr)
{
	// Add binding specification
	const deUint32							binding = (deUint32)m_vertexBindingDescriptions.size();
	const VkVertexInputBindingDescription	bindingDescription =
	{
		binding,
		sizePerElement,
		VK_VERTEX_INPUT_RATE_VERTEX
	};

	m_vertexBindingDescriptions.push_back(bindingDescription);

	// Add location and format specification
	const VkVertexInputAttributeDescription attributeDescription =
	{
		bindingLocation,			// deUint32	location;
		binding,					// deUint32	binding;
		format,						// VkFormat	format;
		0u,							// deUint32	offsetInBytes;
	};

	m_vertexAttributeDescriptions.push_back(attributeDescription);

	// Upload data to buffer
	const VkDevice				vkDevice			= m_context.getDevice();
	const DeviceInterface&		vk					= m_context.getDeviceInterface();
	const deUint32				queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();

	const VkDeviceSize			inputSize			= sizePerElement * count;
	const VkBufferCreateInfo	vertexBufferParams	=
	{
		VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
		DE_NULL,									// const void*			pNext;
		0u,											// VkBufferCreateFlags	flags;
		inputSize,									// VkDeviceSize			size;
		VK_BUFFER_USAGE_VERTEX_BUFFER_BIT,			// VkBufferUsageFlags	usage;
		VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
		1u,											// deUint32				queueFamilyCount;
		&queueFamilyIndex							// const deUint32*		pQueueFamilyIndices;
	};

	Move<VkBuffer>			buffer	= createBuffer(vk, vkDevice, &vertexBufferParams);
	de::MovePtr<Allocation>	alloc	= m_context.getDefaultAllocator().allocate(getBufferMemoryRequirements(vk, vkDevice, *buffer), MemoryRequirement::HostVisible);

	VK_CHECK(vk.bindBufferMemory(vkDevice, *buffer, alloc->getMemory(), alloc->getOffset()));

	deMemcpy(alloc->getHostPtr(), dataPtr, (size_t)inputSize);
	flushMappedMemoryRange(vk, vkDevice, alloc->getMemory(), alloc->getOffset(), inputSize);

	m_vertexBuffers.push_back(de::SharedPtr<Unique<VkBuffer> >(new Unique<VkBuffer>(buffer)));
	m_vertexBufferAllocs.push_back(AllocationSp(alloc.release()));
}